

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Struct.cpp
# Opt level: O1

void __thiscall soul::Structure::Structure(Structure *this,string *nm,void *backlink)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  long lVar5;
  
  (this->super_RefCountedObject).refCount = 0;
  this->backlinkToASTObject = backlink;
  this->activeUseFlag = false;
  (this->members).items = (Member *)(this->members).space;
  (this->members).numActive = 0;
  (this->members).numAllocated = 8;
  paVar2 = &(this->name).field_2;
  (this->name)._M_dataplus._M_p = (pointer)paVar2;
  pcVar3 = (nm->_M_dataplus)._M_p;
  paVar1 = &nm->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&nm->field_2 + 8);
    paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->name).field_2 + 8) = uVar4;
  }
  else {
    (this->name)._M_dataplus._M_p = pcVar3;
    paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->name)._M_string_length = nm->_M_string_length;
  (nm->_M_dataplus)._M_p = (pointer)paVar1;
  nm->_M_string_length = 0;
  (nm->field_2)._M_local_buf[0] = '\0';
  (this->memberIndexMap)._M_h._M_buckets = &(this->memberIndexMap)._M_h._M_single_bucket;
  (this->memberIndexMap)._M_h._M_bucket_count = 1;
  (this->memberIndexMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->memberIndexMap)._M_h._M_element_count = 0;
  (this->memberIndexMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->memberIndexMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->memberIndexMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  lVar5 = std::__cxx11::string::find((char)&this->name,0x23);
  if (lVar5 == -1) {
    return;
  }
  throwInternalCompilerError("! containsChar (name, \'#\')","Structure",0x20);
}

Assistant:

Structure::Structure (std::string nm, void* backlink)
  : backlinkToASTObject (backlink), name (std::move (nm))
{
    SOUL_ASSERT (! containsChar (name, '#'));
}